

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::updateShortRangePotentials(SPFForceManager *this)

{
  long in_RDI;
  SPFForceManager *this_00;
  double dVar1;
  double tp;
  RealType inversionPotential;
  RealType torsionPotential;
  RealType bendPotential;
  RealType bondPotential;
  double in_stack_ffffffffffffffe0;
  double in_stack_ffffffffffffffe8;
  SPFForceManager *in_stack_fffffffffffffff0;
  
  Snapshot::getBondPotential(*(Snapshot **)(in_RDI + 0xc98));
  Snapshot::getBondPotential(*(Snapshot **)(in_RDI + 0xca0));
  this_00 = (SPFForceManager *)
            linearCombination<double>
                      (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0
                      );
  Snapshot::setBondPotential(*(Snapshot **)(in_RDI + 0xc90),(RealType)this_00);
  Snapshot::getBendPotential(*(Snapshot **)(in_RDI + 0xc98));
  Snapshot::getBendPotential(*(Snapshot **)(in_RDI + 0xca0));
  dVar1 = linearCombination<double>(this_00,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Snapshot::setBendPotential(*(Snapshot **)(in_RDI + 0xc90),dVar1);
  Snapshot::getTorsionPotential(*(Snapshot **)(in_RDI + 0xc98));
  Snapshot::getTorsionPotential(*(Snapshot **)(in_RDI + 0xca0));
  tp = linearCombination<double>(this_00,dVar1,in_stack_ffffffffffffffe0);
  Snapshot::setTorsionPotential(*(Snapshot **)(in_RDI + 0xc90),tp);
  Snapshot::getInversionPotential(*(Snapshot **)(in_RDI + 0xc98));
  Snapshot::getInversionPotential(*(Snapshot **)(in_RDI + 0xca0));
  dVar1 = linearCombination<double>(this_00,dVar1,tp);
  Snapshot::setInversionPotential(*(Snapshot **)(in_RDI + 0xc90),dVar1);
  return;
}

Assistant:

void SPFForceManager::updateShortRangePotentials() {
    RealType bondPotential =
        linearCombination(temporarySourceSnapshot_->getBondPotential(),
                          temporarySinkSnapshot_->getBondPotential());
    currentSnapshot_->setBondPotential(bondPotential);

    RealType bendPotential =
        linearCombination(temporarySourceSnapshot_->getBendPotential(),
                          temporarySinkSnapshot_->getBendPotential());
    currentSnapshot_->setBendPotential(bendPotential);

    RealType torsionPotential =
        linearCombination(temporarySourceSnapshot_->getTorsionPotential(),
                          temporarySinkSnapshot_->getTorsionPotential());
    currentSnapshot_->setTorsionPotential(torsionPotential);

    RealType inversionPotential =
        linearCombination(temporarySourceSnapshot_->getInversionPotential(),
                          temporarySinkSnapshot_->getInversionPotential());
    currentSnapshot_->setInversionPotential(inversionPotential);
  }